

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__cloexec_ioctl(int fd,int set)

{
  int iVar1;
  int *piVar2;
  
  do {
    iVar1 = ioctl(fd,0x5451 - (ulong)(set == 0));
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        return 0;
      }
      piVar2 = __errno_location();
      break;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return -*piVar2;
}

Assistant:

int uv__cloexec_ioctl(int fd, int set) {
  int r;

  do
    r = ioctl(fd, set ? FIOCLEX : FIONCLEX);
  while (r == -1 && errno == EINTR);

  if (r)
    return -errno;

  return 0;
}